

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O3

int ON_BrepConeEdge(ON_Brep *brep,int edge_index,ON_3dPoint apex_point)

{
  ON_BrepEdge *pOVar1;
  ON_NurbsSurface *pSurface;
  ON_BrepFace *pOVar2;
  uint uVar3;
  int vid [4];
  bool local_4c [4];
  int local_48 [5];
  int local_34;
  undefined8 local_30;
  
  if ((-1 < edge_index) ||
     (uVar3 = 0,
     edge_index <
     (brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count)) {
    uVar3 = 0;
    pSurface = ON_BrepExtrudeHelper_MakeConeSrf
                         (&apex_point,
                          (brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                          super_ON_ClassArray<ON_BrepEdge>.m_a + edge_index,false);
    if (pSurface != (ON_NurbsSurface *)0x0) {
      pOVar1 = (brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
      local_48[4] = pOVar1[edge_index].m_vi[0];
      local_34 = pOVar1[edge_index].m_vi[1];
      local_30 = 0xffffffffffffffff;
      local_48[1] = -1;
      local_48[2] = -1;
      local_48[3] = 0xffffffff;
      local_4c[0] = false;
      local_4c[1] = false;
      local_4c[2] = false;
      local_4c[3] = false;
      local_48[0] = edge_index;
      pOVar2 = ON_Brep::NewFace(brep,&pSurface->super_ON_Surface,local_48 + 4,local_48,local_4c);
      uVar3 = (uint)(pOVar2 != (ON_BrepFace *)0x0);
    }
  }
  return uVar3;
}

Assistant:

int ON_BrepConeEdge( 
          ON_Brep& brep,
          int edge_index,
          ON_3dPoint apex_point
          )
{
  //ON_3dVector path_vector;

  if ( edge_index < 0 && edge_index >= brep.m_E.Count() )
    return false;

  // make sides
  ON_NurbsSurface* cone_srf = ON_BrepExtrudeHelper_MakeConeSrf( 
                              apex_point, brep.m_E[edge_index], false );

  if ( !cone_srf )
    return false;

  int vid[4], eid[4];
  bool bRev3d[4];

  vid[0] = brep.m_E[edge_index].m_vi[0];
  vid[1] = brep.m_E[edge_index].m_vi[1];
  vid[2] = -1;
  vid[3] = -1;

  eid[0] = edge_index;
  eid[1] = -1;
  eid[2] = -1;
  eid[3] = -1;

  bRev3d[0] = false;
  bRev3d[1] = false;
  bRev3d[2] = false;
  bRev3d[3] = false;

  return brep.NewFace( cone_srf, vid, eid, bRev3d ) ? true : false;
}